

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_frameProgression *
ZSTD_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTD_CCtx *cctx)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  long lVar3;
  
  if (cctx->inBuff == (char *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = cctx->inBuffPos - cctx->inToCompress;
  }
  uVar1 = cctx->consumedSrcSize;
  uVar2 = cctx->producedCSize;
  __return_storage_ptr__->ingested = lVar3 + cctx->consumedSrcSize;
  __return_storage_ptr__->consumed = uVar1;
  __return_storage_ptr__->produced = uVar2;
  return __return_storage_ptr__;
}

Assistant:

ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        return ZSTDMT_getFrameProgression(cctx->mtctx);
    }
#endif
    {   ZSTD_frameProgression fp;
        size_t const buffered = (cctx->inBuff == NULL) ? 0 :
                                cctx->inBuffPos - cctx->inToCompress;
        if (buffered) assert(cctx->inBuffPos >= cctx->inToCompress);
        assert(buffered <= ZSTD_BLOCKSIZE_MAX);
        fp.ingested = cctx->consumedSrcSize + buffered;
        fp.consumed = cctx->consumedSrcSize;
        fp.produced = cctx->producedCSize;
        return fp;
}   }